

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_read_deviate_minmax(lys_deviate *deviate,lys_node *dev_target,uint32_t value,int type)

{
  uint uVar1;
  ly_ctx *ctx;
  long lVar2;
  long lVar3;
  uint8_t *puVar4;
  char *pcVar5;
  
  ctx = dev_target->module->ctx;
  if (dev_target->nodetype == LYS_LEAFLIST) {
    lVar3 = 0xd0;
    lVar2 = 0xd4;
  }
  else {
    if (dev_target->nodetype != LYS_LIST) {
      pcVar5 = "max-elements";
      if (type == 0) {
        pcVar5 = "min-elements";
      }
      ly_vlog(ctx,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,pcVar5);
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Target node does not allow \"%s\" property.",
              pcVar5);
      return 1;
    }
    lVar3 = 0x98;
    lVar2 = 0x9c;
  }
  puVar4 = dev_target->padding + lVar2 + -0x1c;
  if (type == 0) {
    puVar4 = dev_target->padding + lVar3 + -0x1c;
  }
  if ((deviate->mod == LY_DEVIATE_ADD) && (*(uint *)puVar4 != 0)) {
    pcVar5 = "max-elements";
    if (type == 0) {
      pcVar5 = "min-elements";
    }
    ly_vlog(ctx,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,pcVar5);
    pcVar5 = "Adding property that already exists.";
  }
  else {
    *(uint32_t *)puVar4 = value;
    uVar1 = *(uint *)(dev_target->padding + lVar2 + -0x1c);
    if (uVar1 == 0) {
      return 0;
    }
    if (*(uint *)(dev_target->padding + lVar3 + -0x1c) <= uVar1) {
      return 0;
    }
    if (type == 0) {
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Invalid value \"%d\" of \"min-elements\".");
      pcVar5 = "\"min-elements\" is bigger than \"max-elements\".";
    }
    else {
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Invalid value \"%d\" of \"max-elements\".");
      pcVar5 = "\"max-elements\" is smaller than \"min-elements\".";
    }
  }
  ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar5);
  return 1;
}

Assistant:

int
yang_read_deviate_minmax(struct lys_deviate *deviate, struct lys_node *dev_target, uint32_t value, int type)
{
    struct ly_ctx *ctx = dev_target->module->ctx;
    uint32_t *ui32val, *min, *max;

    /* check target node type */
    if (dev_target->nodetype == LYS_LEAFLIST) {
        max = &((struct lys_node_leaflist *)dev_target)->max;
        min = &((struct lys_node_leaflist *)dev_target)->min;
    } else if (dev_target->nodetype == LYS_LIST) {
        max = &((struct lys_node_list *)dev_target)->max;
        min = &((struct lys_node_list *)dev_target)->min;
    } else {
        LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, (type) ? "max-elements" : "min-elements");
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"%s\" property.", (type) ? "max-elements" : "min-elements");
        goto error;
    }

    ui32val = (type) ? max : min;
    if (deviate->mod == LY_DEVIATE_ADD) {
        /* check that there is no current value */
        if (*ui32val) {
            LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, (type) ? "max-elements" : "min-elements");
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Adding property that already exists.");
            goto error;
        }
    } else if (deviate->mod == LY_DEVIATE_RPL) {
        /* unfortunately, there is no way to check reliably that there
         * was a value before, it could have been the default */
    }

    /* add (already checked) and replace */
    /* set new value specified in deviation */
    *ui32val = value;

    /* check min-elements is smaller than max-elements */
    if (*max && *min > *max) {
        if (type) {
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Invalid value \"%d\" of \"max-elements\".", value);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "\"max-elements\" is smaller than \"min-elements\".");
        } else {
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Invalid value \"%d\" of \"min-elements\".", value);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "\"min-elements\" is bigger than \"max-elements\".");
        }
        goto error;
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}